

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O2

void __thiscall adjMaxtrix<char>::DepthFirstSearch(adjMaxtrix<char> *this,_func_void_char *Visit)

{
  int *visited;
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  pointer pcVar4;
  
  pcVar4 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)pcVar2 - (long)pcVar4;
  visited = (int *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    visited[uVar1] = 0;
  }
  for (uVar1 = 0; uVar1 < (ulong)((long)pcVar2 - (long)pcVar4); uVar1 = uVar1 + 1) {
    if (visited[uVar1] == 0) {
      DFS(this,(int)uVar1,visited,Visit);
      pcVar4 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  operator_delete__(visited);
  return;
}

Assistant:

void adjMaxtrix<dataType>::DepthFirstSearch(void Visit(dataType item)) {
	int i;
	int *visited = new int[vexs.size()];
	for (i = 0; i < vexs.size(); i++)
		visited[i] = 0;			//初始标记数组
	for (i = 0; i < vexs.size(); i++)
		if (!visited[i])
			DFS(i, visited, Visit);	//以每个顶点为初始顶点进行调用
	delete[] visited;
}